

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

ALCuint __thiscall anon_unknown.dwarf_211787::AlsaCapture::availableSamples(AlsaCapture *this)

{
  FILE *__stream;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  size_type sVar5;
  long lVar6;
  long *plVar7;
  ulong cnt;
  pointer this_00;
  size_t sVar8;
  long in_RDI;
  char *err_1;
  snd_pcm_sframes_t amt;
  ll_ringbuffer_data_pair vec;
  char *err;
  snd_pcm_sframes_t avail;
  undefined8 in_stack_ffffffffffffff80;
  FILE *__stream_00;
  atomic<bool> *in_stack_ffffffffffffff88;
  RingBuffer *in_stack_ffffffffffffffb0;
  ulong local_48;
  undefined8 local_40;
  RingBuffer *local_38;
  RingBuffer *in_stack_ffffffffffffffd0;
  ulong local_18 [2];
  ALCuint local_4;
  
  local_18[0] = 0;
  bVar2 = std::atomic<bool>::load
                    (in_stack_ffffffffffffff88,
                     (memory_order)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  if ((bVar2) && ((*(byte *)(in_RDI + 0x30) & 1) != 0)) {
    local_18[0] = (*(anonymous_namespace)::psnd_pcm_avail_update)(*(undefined8 *)(in_RDI + 0x10));
  }
  __stream = gLogFile;
  if ((long)local_18[0] < 0) {
    if (0 < (int)gLogLevel) {
      uVar4 = (*(anonymous_namespace)::psnd_strerror)(local_18[0] & 0xffffffff);
      fprintf((FILE *)__stream,"[ALSOFT] (EE) avail update failed: %s\n",uVar4);
    }
    iVar3 = (*(anonymous_namespace)::psnd_pcm_recover)
                      (*(undefined8 *)(in_RDI + 0x10),local_18[0] & 0xffffffff,1);
    local_18[0] = (ulong)iVar3;
    if (-1 < (long)local_18[0]) {
      if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
        iVar3 = (*(anonymous_namespace)::psnd_pcm_start)(*(undefined8 *)(in_RDI + 0x10));
        local_18[0] = (ulong)iVar3;
      }
      if (-1 < (long)local_18[0]) {
        local_18[0] = (*(anonymous_namespace)::psnd_pcm_avail_update)
                                (*(undefined8 *)(in_RDI + 0x10));
      }
    }
    if ((long)local_18[0] < 0) {
      uVar4 = (*(anonymous_namespace)::psnd_strerror)(local_18[0] & 0xffffffff);
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar4);
      }
      ALCdevice::handleDisconnect(*(ALCdevice **)(in_RDI + 8),"Capture recovery failure: %s",uVar4);
    }
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x2348d4);
  pcVar1 = (anonymous_namespace)::psnd_pcm_bytes_to_frames;
  if (bVar2) {
    while (0 < (long)local_18[0]) {
      std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x234978);
      RingBuffer::getWriteVector(in_stack_ffffffffffffffd0);
      if (local_38 == (RingBuffer *)0x0) break;
      in_stack_ffffffffffffffb0 = local_38;
      plVar7 = std::min<long>((long *)&stack0xffffffffffffffb0,(long *)local_18);
      cnt = (*(anonymous_namespace)::psnd_pcm_readi)
                      (*(undefined8 *)(in_RDI + 0x10),local_40,*plVar7);
      if ((long)cnt < 0) {
        if (0 < (int)gLogLevel) {
          __stream_00 = (FILE *)gLogFile;
          uVar4 = (*(anonymous_namespace)::psnd_strerror)(cnt & 0xffffffff);
          fprintf(__stream_00,"[ALSOFT] (EE) read error: %s\n",uVar4);
        }
        if (cnt != 0xfffffffffffffff5) {
          iVar3 = (*(anonymous_namespace)::psnd_pcm_recover)
                            (*(undefined8 *)(in_RDI + 0x10),cnt & 0xffffffff,1);
          local_48 = (ulong)iVar3;
          if (-1 < (long)local_48) {
            if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
              iVar3 = (*(anonymous_namespace)::psnd_pcm_start)(*(undefined8 *)(in_RDI + 0x10));
              local_48 = (ulong)iVar3;
            }
            if (-1 < (long)local_48) {
              local_48 = (*(anonymous_namespace)::psnd_pcm_avail_update)
                                   (*(undefined8 *)(in_RDI + 0x10));
            }
          }
          if ((long)local_48 < 0) {
            uVar4 = (*(anonymous_namespace)::psnd_strerror)(local_48 & 0xffffffff);
            if (0 < (int)gLogLevel) {
              fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar4);
            }
            ALCdevice::handleDisconnect
                      (*(ALCdevice **)(in_RDI + 8),"Capture recovery failure: %s",uVar4);
            break;
          }
          local_18[0] = local_48;
        }
      }
      else {
        this_00 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                            ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x234b3b);
        RingBuffer::writeAdvance(this_00,cnt);
        local_18[0] = local_18[0] - cnt;
      }
    }
    std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x234b6d);
    sVar8 = RingBuffer::readSpace(in_stack_ffffffffffffffb0);
    local_4 = (ALCuint)sVar8;
  }
  else {
    if ((long)local_18[0] < 0) {
      local_18[0] = 0;
    }
    uVar4 = *(undefined8 *)(in_RDI + 0x10);
    sVar5 = std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::size
                      ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)(in_RDI + 0x18));
    lVar6 = (*pcVar1)(uVar4,sVar5);
    if (*(long *)(in_RDI + 0x40) < (long)(lVar6 + local_18[0])) {
      *(ulong *)(in_RDI + 0x40) = lVar6 + local_18[0];
    }
    local_4 = (ALCuint)*(undefined8 *)(in_RDI + 0x40);
  }
  return local_4;
}

Assistant:

ALCuint AlsaCapture::availableSamples()
{
    snd_pcm_sframes_t avail{0};
    if(mDevice->Connected.load(std::memory_order_acquire) && mDoCapture)
        avail = snd_pcm_avail_update(mPcmHandle);
    if(avail < 0)
    {
        ERR("avail update failed: %s\n", snd_strerror(static_cast<int>(avail)));

        if((avail=snd_pcm_recover(mPcmHandle, static_cast<int>(avail), 1)) >= 0)
        {
            if(mDoCapture)
                avail = snd_pcm_start(mPcmHandle);
            if(avail >= 0)
                avail = snd_pcm_avail_update(mPcmHandle);
        }
        if(avail < 0)
        {
            const char *err{snd_strerror(static_cast<int>(avail))};
            ERR("restore error: %s\n", err);
            mDevice->handleDisconnect("Capture recovery failure: %s", err);
        }
    }

    if(!mRing)
    {
        if(avail < 0) avail = 0;
        avail += snd_pcm_bytes_to_frames(mPcmHandle, static_cast<ssize_t>(mBuffer.size()));
        if(avail > mLastAvail) mLastAvail = avail;
        return static_cast<ALCuint>(mLastAvail);
    }

    while(avail > 0)
    {
        auto vec = mRing->getWriteVector();
        if(vec.first.len == 0) break;

        snd_pcm_sframes_t amt{std::min(static_cast<snd_pcm_sframes_t>(vec.first.len), avail)};
        amt = snd_pcm_readi(mPcmHandle, vec.first.buf, static_cast<snd_pcm_uframes_t>(amt));
        if(amt < 0)
        {
            ERR("read error: %s\n", snd_strerror(static_cast<int>(amt)));

            if(amt == -EAGAIN)
                continue;
            if((amt=snd_pcm_recover(mPcmHandle, static_cast<int>(amt), 1)) >= 0)
            {
                if(mDoCapture)
                    amt = snd_pcm_start(mPcmHandle);
                if(amt >= 0)
                    amt = snd_pcm_avail_update(mPcmHandle);
            }
            if(amt < 0)
            {
                const char *err{snd_strerror(static_cast<int>(amt))};
                ERR("restore error: %s\n", err);
                mDevice->handleDisconnect("Capture recovery failure: %s", err);
                break;
            }
            avail = amt;
            continue;
        }

        mRing->writeAdvance(static_cast<snd_pcm_uframes_t>(amt));
        avail -= amt;
    }

    return static_cast<ALCuint>(mRing->readSpace());
}